

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall RefTable::Resize(RefTable *this,SQUnsignedInteger size)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  RefNode **p;
  SQUnsignedInteger SVar3;
  SQTable *pSVar4;
  ulong uVar5;
  RefNode *pRVar6;
  SQUnsignedInteger SVar7;
  SQUnsignedInteger SVar8;
  RefNode *obj;
  
  p = this->_buckets;
  SVar3 = this->_numofslots;
  obj = this->_nodes;
  AllocNodes(this,size);
  SVar8 = 0;
  SVar7 = SVar3;
  do {
    if (SVar7 == 0) {
      if (SVar8 == SVar3) {
        sq_vm_free(p,SVar3 * 0x28);
        return;
      }
      __assert_fail("nfound == oldnumofslots",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                    ,0x1e8,"void RefTable::Resize(SQUnsignedInteger)");
    }
    SVar2 = (obj->obj).super_SQObject._type;
    if (SVar2 != OT_NULL) {
      if (obj->refs == 0) {
        __assert_fail("t->refs != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                      ,0x1e0,"void RefTable::Resize(SQUnsignedInteger)");
      }
      if ((int)SVar2 < 0x5000004) {
        if ((SVar2 == OT_BOOL) || (SVar2 == OT_INTEGER)) {
          uVar5 = (obj->obj).super_SQObject._unVal.nInteger;
        }
        else {
LAB_0012b79b:
          uVar5 = (obj->obj).super_SQObject._unVal.nInteger >> 3;
        }
      }
      else if (SVar2 == OT_FLOAT) {
        uVar5 = (ulong)(obj->obj).super_SQObject._unVal.fFloat;
      }
      else {
        if (SVar2 != OT_STRING) goto LAB_0012b79b;
        uVar5 = ((obj->obj).super_SQObject._unVal.pString)->_hash;
      }
      pRVar6 = Add(this,this->_numofslots - 1 & uVar5,(SQObject *)obj);
      pRVar6->refs = obj->refs;
      pSVar4 = (obj->obj).super_SQObject._unVal.pTable;
      SVar2 = (obj->obj).super_SQObject._type;
      (obj->obj).super_SQObject._type = OT_NULL;
      (obj->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      SVar8 = SVar8 + 1;
    }
    obj = obj + 1;
    SVar7 = SVar7 - 1;
  } while( true );
}

Assistant:

void RefTable::Resize(SQUnsignedInteger size)
{
    RefNode **oldbucks = _buckets;
    RefNode *t = _nodes;
    SQUnsignedInteger oldnumofslots = _numofslots;
    AllocNodes(size);
    //rehash
    SQUnsignedInteger nfound = 0;
    for(SQUnsignedInteger n = 0; n < oldnumofslots; n++) {
        if(type(t->obj) != OT_NULL) {
            //add back;
            assert(t->refs != 0);
            RefNode *nn = Add(::HashObj(t->obj)&(_numofslots-1),t->obj);
            nn->refs = t->refs;
            t->obj.Null();
            nfound++;
        }
        t++;
    }
    assert(nfound == oldnumofslots);
    SQ_FREE(oldbucks,(oldnumofslots * sizeof(RefNode *)) + (oldnumofslots * sizeof(RefNode)));
}